

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustr_cnv.cpp
# Opt level: O0

UChar * u_uastrncpy_63(UChar *ucs1,char *s2,int32_t n)

{
  char *pcVar1;
  UBool UVar2;
  int32_t iVar3;
  UConverter *converter;
  UChar *targetLimit;
  UConverter *cnv;
  UChar *pUStack_28;
  UErrorCode err;
  UChar *target;
  char *pcStack_18;
  int32_t n_local;
  char *s2_local;
  UChar *ucs1_local;
  
  cnv._4_4_ = U_ZERO_ERROR;
  pUStack_28 = ucs1;
  target._4_4_ = n;
  pcStack_18 = s2;
  s2_local = (char *)ucs1;
  converter = u_getDefaultConverter_63((UErrorCode *)((long)&cnv + 4));
  UVar2 = U_SUCCESS(cnv._4_4_);
  if ((UVar2 == '\0') || (converter == (UConverter *)0x0)) {
    s2_local[0] = '\0';
    s2_local[1] = '\0';
  }
  else {
    ucnv_reset_63(converter);
    pcVar1 = pcStack_18;
    targetLimit = (UChar *)(s2_local + (long)target._4_4_ * 2);
    iVar3 = u_astrnlen(pcStack_18,target._4_4_);
    ucnv_toUnicode_63(converter,&stack0xffffffffffffffd8,targetLimit,&stack0xffffffffffffffe8,
                      pcVar1 + iVar3,(int32_t *)0x0,'\x01',(UErrorCode *)((long)&cnv + 4));
    ucnv_reset_63(converter);
    u_releaseDefaultConverter_63(converter);
    UVar2 = U_FAILURE(cnv._4_4_);
    if ((UVar2 != '\0') && (cnv._4_4_ != U_BUFFER_OVERFLOW_ERROR)) {
      s2_local[0] = '\0';
      s2_local[1] = '\0';
    }
    if (pUStack_28 < s2_local + (long)target._4_4_ * 2) {
      *pUStack_28 = L'\0';
    }
  }
  return (UChar *)s2_local;
}

Assistant:

U_CAPI UChar*  U_EXPORT2
u_uastrncpy(UChar *ucs1,
           const char *s2,
           int32_t n)
{
  UChar *target = ucs1;
  UErrorCode err = U_ZERO_ERROR;
  UConverter *cnv = u_getDefaultConverter(&err);
  if(U_SUCCESS(err) && cnv != NULL) {
    ucnv_reset(cnv);
    ucnv_toUnicode(cnv,
                   &target,
                   ucs1+n,
                   &s2,
                   s2+u_astrnlen(s2, n),
                   NULL,
                   TRUE,
                   &err);
    ucnv_reset(cnv); /* be good citizens */
    u_releaseDefaultConverter(cnv);
    if(U_FAILURE(err) && (err != U_BUFFER_OVERFLOW_ERROR) ) {
      *ucs1 = 0; /* failure */
    }
    if(target < (ucs1+n)) { /* U_BUFFER_OVERFLOW_ERROR isn't an err, just means no termination will happen. */
      *target = 0;  /* terminate */
    }
  } else {
    *ucs1 = 0;
  }
  return ucs1;
}